

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# finders.c
# Opt level: O3

int f_graddesc_test(void *data,int x,int z,double p)

{
  ulong *puVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  if ((*(char **)((long)data + 0x70) == (char *)0x0) ||
     (uVar5 = 1, **(char **)((long)data + 0x70) == '\0')) {
    lVar7 = (long)((x - *(int *)((long)data + 0x14)) +
                  (z - *(int *)((long)data + 0x18)) * *(int *)((long)data + 0x1c));
    uVar5 = 0;
    if (*(int *)(*(long *)((long)data + 8) + lVar7 * 4) == -1) {
      uVar6 = getBiomeAt(*data,*(int *)((long)data + 0x10),x,*(int *)((long)data + 0x24),z);
      *(uint *)(*(long *)((long)data + 8) + lVar7 * 4) = uVar6;
      uVar5 = uVar6 - 0x80 & 0xff;
      if ((int)uVar6 < 0x80) {
        uVar5 = uVar6;
      }
      puVar1 = (ulong *)((long)data + (ulong)(0x7f < (int)uVar6) * 8 + 0x30);
      *puVar1 = *puVar1 | 1L << ((byte)uVar5 & 0x3f);
      uVar2 = *(ulong *)((long)data + 0x50);
      uVar3 = *(ulong *)((long)data + 0x58);
      uVar4 = *(ulong *)((long)data + 0x30);
      if ((uVar3 == 0 && uVar2 == 0) ||
         ((uVar5 = 1, (uVar4 & uVar2) == 0 && ((*(ulong *)((long)data + 0x38) & uVar3) == 0)))) {
        bVar8 = true;
        if ((uVar4 & *(ulong *)((long)data + 0x60)) == 0) {
          bVar8 = (*(ulong *)((long)data + 0x38) & *(ulong *)((long)data + 0x68)) != 0;
        }
        bVar9 = false;
        if ((*(ulong *)((long)data + 0x40) & ~uVar4) == 0) {
          bVar9 = (*(ulong *)((long)data + 0x48) & ~*(ulong *)((long)data + 0x38)) == 0;
        }
        uVar5 = (uint)(((bVar9 || *(ulong *)((long)data + 0x48) == 0 &&
                                  *(ulong *)((long)data + 0x40) == 0) &&
                       (bVar8 || *(ulong *)((long)data + 0x68) == 0 &&
                                 *(ulong *)((long)data + 0x60) == 0)) && (uVar3 == 0 && uVar2 == 0))
        ;
      }
    }
  }
  return uVar5;
}

Assistant:

static int f_graddesc_test(void *data, int x, int z, double p)
{
    (void) p;
    gdt_info_t *info = (gdt_info_t *) data;
    if (info->stop && *info->stop)
        return 1;
    int idx = (z - info->r.z) * info->r.sx + (x - info->r.x);
    if (info->ids[idx] != -1)
        return 0;
    int id = getBiomeAt(info->g, info->r.scale, x, info->r.y, z);
    info->ids[idx] = id;
    if (id < 128) info->b |= (1ULL << id);
    else info->m |= (1ULL << (id-128));

    // check if we know enough to stop
    int match_exc = (info->bexc|info->mexc) == 0;
    int match_any = (info->bany|info->many) == 0;
    int match_req = (info->breq|info->mreq) == 0;
    if (!match_exc && ((info->b & info->bexc) || (info->m & info->mexc)))
        return 1; // encountered an excluded biome -> stop
    match_any |= ((info->b & info->bany) || (info->m & info->many));
    match_req |= ((info->b & info->breq) == info->breq &&
                  (info->m & info->mreq) == info->mreq);
    if (match_exc && match_any && match_req)
        return 1; // all conditions met -> stop
    return 0;
}